

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void fmt::v11::detail::parse_format_string<char,fmt::v11::detail::format_handler<char>>
               (basic_string_view<char> fmt,format_handler<char> *handler)

{
  unkbyte10 Var1;
  char cVar2;
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  basic_string_view<char> value;
  basic_string_view<char> value_00;
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  undefined1 value_03 [16];
  undefined1 value_04 [16];
  handle h;
  handle h_00;
  custom_value<fmt::v11::context> custom;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  long in_RDX;
  char c;
  char *p;
  char *end;
  char *begin;
  char c_1;
  id_adapter adapter;
  int arg_id;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  undefined2 in_stack_fffffffffffffcf0;
  undefined6 in_stack_fffffffffffffcf2;
  format_handler<char> *in_stack_fffffffffffffcf8;
  float fVar7;
  format_handler<char> *pfVar6;
  format_handler<char> *in_stack_fffffffffffffd00;
  undefined2 in_stack_fffffffffffffd08;
  undefined6 in_stack_fffffffffffffd0a;
  format_handler<char> *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  context *in_stack_fffffffffffffd20;
  custom_value<fmt::v11::context> *in_stack_fffffffffffffd28;
  char local_2b9;
  default_arg_formatter<char> *in_stack_fffffffffffffd50;
  default_arg_formatter<char> *this;
  default_arg_formatter<char> *in_stack_fffffffffffffd58;
  default_arg_formatter<char> *in_stack_fffffffffffffd60;
  char *local_250;
  basic_string_view<char> local_230;
  char local_219;
  int local_210;
  int local_204;
  long local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  iterator in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  appender in_stack_fffffffffffffe38;
  monostate local_199;
  void *local_198;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_190;
  handle local_188;
  basic_string_view<char> local_178;
  uint128_opt *local_168;
  uint128_opt *local_158;
  uint128_opt *local_148;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_140;
  int128_opt *local_138;
  int128_opt *local_128;
  int128_opt *local_118;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *local_110;
  format_handler<char> *local_100;
  custom_value<fmt::v11::context> *local_f8;
  default_arg_formatter<char> local_f0;
  uint128_opt *local_e8;
  undefined2 uStack_e0;
  undefined6 uStack_de;
  undefined4 local_d8;
  char *local_c8;
  int local_bc;
  monostate local_a9 [17];
  handle local_98;
  basic_string_view<char> local_88;
  uint128_opt *local_78;
  uint128_opt *local_68;
  int128_opt *local_48;
  int128_opt *local_38;
  default_arg_formatter<char> *local_10;
  uint128_opt **local_8;
  
  pcVar3 = basic_string_view<char>::data(&local_230);
  sVar4 = basic_string_view<char>::size(&local_230);
  pcVar5 = pcVar3 + sVar4;
  do {
    while( true ) {
      local_250 = pcVar3;
      if (local_250 == pcVar5) {
        format_handler<char>::on_text
                  (in_stack_fffffffffffffd10,
                   (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
                   (char *)in_stack_fffffffffffffd00);
        return;
      }
      pcVar3 = local_250 + 1;
      if (*local_250 == '{') break;
      if (*local_250 == '}') {
        if ((pcVar3 == pcVar5) || (*pcVar3 != '}')) {
          format_handler<char>::on_error
                    ((format_handler<char> *)
                     CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                     (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        }
        format_handler<char>::on_text
                  (in_stack_fffffffffffffd10,
                   (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
                   (char *)in_stack_fffffffffffffd00);
        pcVar3 = local_250 + 2;
      }
    }
    format_handler<char>::on_text
              (in_stack_fffffffffffffd10,
               (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
               (char *)in_stack_fffffffffffffd00);
    local_1f0 = local_250 + 1;
    local_1f8 = pcVar5;
    if (local_1f0 == pcVar5) {
      format_handler<char>::on_error
                ((format_handler<char> *)
                 CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                 (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    }
    local_204 = 0;
    cVar2 = *local_1f0;
    if (cVar2 == ':') {
      local_204 = format_handler<char>::on_arg_id((format_handler<char> *)0x196940);
LAB_00196deb:
      local_1f0 = format_handler<char>::on_format_specs
                            ((format_handler<char> *)in_stack_fffffffffffffe38.container,
                             in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,
                             (char *)in_stack_fffffffffffffe20.container);
      if ((local_1f0 == local_1f8) || (*local_1f0 != '}')) {
        format_handler<char>::on_error
                  ((format_handler<char> *)
                   CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                   (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      }
      local_1e8 = local_1f0 + 1;
    }
    else if (cVar2 == '{') {
      format_handler<char>::on_text
                (in_stack_fffffffffffffd10,
                 (char *)CONCAT62(in_stack_fffffffffffffd0a,in_stack_fffffffffffffd08),
                 (char *)in_stack_fffffffffffffd00);
      local_1e8 = local_1f0 + 1;
    }
    else if (cVar2 == '}') {
      local_bc = format_handler<char>::on_arg_id((format_handler<char> *)0x1964ce);
      local_c8 = local_1f0;
      context::arg((context *)CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffcec);
      local_f0.out.container = context::out((context *)(in_RDX + 0x18));
      this = &local_f0;
      fVar7 = (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      local_10 = this;
      local_8 = &local_e8;
      switch(local_d8) {
      case 0:
      default:
        monostate::monostate(local_a9);
        default_arg_formatter<char>::operator()(this);
        break;
      case 1:
        default_arg_formatter<char>::operator()<int,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(int)fVar7);
        break;
      case 2:
        default_arg_formatter<char>::operator()<unsigned_int,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(uint)fVar7);
        break;
      case 3:
        default_arg_formatter<char>::operator()<long_long,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (longlong)in_stack_fffffffffffffcf8);
        break;
      case 4:
        default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (unsigned_long_long)in_stack_fffffffffffffcf8);
        break;
      case 5:
        x._4_4_ = in_stack_fffffffffffffcec;
        x._0_4_ = in_stack_fffffffffffffce8;
        x._8_2_ = in_stack_fffffffffffffcf0;
        x._10_6_ = in_stack_fffffffffffffcf2;
        local_48 = map((int128_opt *)local_e8,(int128_opt)x);
        value_01._8_7_ = in_stack_fffffffffffffd18;
        value_01._0_8_ = in_stack_fffffffffffffd10;
        value_01[0xf] = in_stack_fffffffffffffd1f;
        local_38 = local_48;
        default_arg_formatter<char>::operator()<__int128,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,(__int128)value_01);
        break;
      case 6:
        x_00._4_4_ = in_stack_fffffffffffffcec;
        x_00._0_4_ = in_stack_fffffffffffffce8;
        x_00._8_2_ = in_stack_fffffffffffffcf0;
        x_00._10_6_ = in_stack_fffffffffffffcf2;
        local_78 = map(local_e8,(uint128_opt)x_00);
        value_02._8_7_ = in_stack_fffffffffffffd18;
        value_02._0_8_ = in_stack_fffffffffffffd10;
        value_02[0xf] = in_stack_fffffffffffffd1f;
        local_68 = local_78;
        default_arg_formatter<char>::operator()<unsigned___int128,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,
                   (unsigned___int128)value_02);
        in_stack_fffffffffffffd60 = this;
        break;
      case 7:
        default_arg_formatter<char>::operator()<bool,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                   (bool)in_stack_fffffffffffffd1f);
        break;
      case 8:
        default_arg_formatter<char>::operator()<char,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (char)((ulong)in_stack_fffffffffffffcf8 >> 0x38));
        break;
      case 9:
        default_arg_formatter<char>::operator()<float,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,fVar7);
        break;
      case 10:
        default_arg_formatter<char>::operator()<double,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (double)in_stack_fffffffffffffcf8);
        break;
      case 0xb:
        in_stack_fffffffffffffce8 = SUB84(local_e8,0);
        in_stack_fffffffffffffcec = (int)((ulong)local_e8 >> 0x20);
        in_stack_fffffffffffffcf0 = uStack_e0;
        default_arg_formatter<char>::operator()<long_double,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd10,
                   (longdouble)CONCAT28(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00));
        break;
      case 0xc:
        default_arg_formatter<char>::operator()<const_char_*,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (char *)in_stack_fffffffffffffcf8);
        break;
      case 0xd:
        local_88 = string_value<char>::str((string_value<char> *)0x19680b);
        value.data_._2_6_ = in_stack_fffffffffffffd0a;
        value.data_._0_2_ = in_stack_fffffffffffffd08;
        value.size_ = (size_t)in_stack_fffffffffffffd10;
        default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,value);
        in_stack_fffffffffffffd58 = this;
        break;
      case 0xe:
        default_arg_formatter<char>::operator()<const_void_*,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                   (void *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
        break;
      case 0xf:
        custom.format._0_2_ = uStack_e0;
        custom.value = local_e8;
        custom.format._2_6_ = uStack_de;
        basic_format_arg<fmt::v11::context>::handle::handle(&local_98,custom);
        h.custom_.format =
             (_func_void_void_ptr_parse_context<char>_ptr_context_ptr *)in_stack_fffffffffffffd60;
        h.custom_.value = in_stack_fffffffffffffd58;
        default_arg_formatter<char>::operator()(this,h);
        in_stack_fffffffffffffd50 = this;
      }
      local_1e8 = local_1f0 + 1;
    }
    else {
      local_210 = 0;
      local_200 = in_RDX;
      local_1f0 = parse_arg_id<char,fmt::v11::detail::parse_replacement_field<char,fmt::v11::detail::format_handler<char>&>(char_const*,char_const*,fmt::v11::detail::format_handler<char>&)::id_adapter&>
                            ((char *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
                             (id_adapter *)
                             CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      local_204 = local_210;
      if (local_1f0 == local_1f8) {
        local_2b9 = '\0';
      }
      else {
        local_2b9 = *local_1f0;
      }
      local_219 = local_2b9;
      if (local_2b9 != '}') {
        if (local_2b9 != ':') {
          format_handler<char>::on_error
                    ((format_handler<char> *)
                     CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                     (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        }
        goto LAB_00196deb;
      }
      in_stack_fffffffffffffd20 = (context *)(local_200 + 0x18);
      in_stack_fffffffffffffd28 = (custom_value<fmt::v11::context> *)&stack0xfffffffffffffe28;
      context::arg((context *)CONCAT62(in_stack_fffffffffffffcf2,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffcec);
      in_stack_fffffffffffffe20 = context::out(in_stack_fffffffffffffd20);
      pfVar6 = (format_handler<char> *)&stack0xfffffffffffffe20;
      fVar7 = (float)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      local_100 = pfVar6;
      local_f8 = in_stack_fffffffffffffd28;
      switch(*(undefined4 *)&in_stack_fffffffffffffd28[1].value) {
      case 0:
      default:
        monostate::monostate(&local_199);
        default_arg_formatter<char>::operator()((default_arg_formatter<char> *)pfVar6);
        in_stack_fffffffffffffcf8 = pfVar6;
        break;
      case 1:
        default_arg_formatter<char>::operator()<int,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(int)fVar7);
        break;
      case 2:
        default_arg_formatter<char>::operator()<unsigned_int,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,(uint)fVar7);
        break;
      case 3:
        default_arg_formatter<char>::operator()<long_long,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (longlong)in_stack_fffffffffffffcf8);
        break;
      case 4:
        default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (unsigned_long_long)in_stack_fffffffffffffcf8);
        break;
      case 5:
        in_stack_fffffffffffffd18 = SUB87(pfVar6,0);
        in_stack_fffffffffffffd1f = (undefined1)((ulong)pfVar6 >> 0x38);
        local_118 = (int128_opt *)in_stack_fffffffffffffd28->value;
        local_110 = in_stack_fffffffffffffd28->format;
        x_01._4_4_ = in_stack_fffffffffffffcec;
        x_01._0_4_ = in_stack_fffffffffffffce8;
        x_01._8_2_ = in_stack_fffffffffffffcf0;
        x_01._10_6_ = in_stack_fffffffffffffcf2;
        local_138 = map(local_118,(int128_opt)x_01);
        value_03._8_7_ = in_stack_fffffffffffffd18;
        value_03._0_8_ = in_stack_fffffffffffffd10;
        value_03[0xf] = in_stack_fffffffffffffd1f;
        local_128 = local_138;
        default_arg_formatter<char>::operator()<__int128,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,(__int128)value_03);
        break;
      case 6:
        local_148 = (uint128_opt *)in_stack_fffffffffffffd28->value;
        local_140 = in_stack_fffffffffffffd28->format;
        x_02._4_4_ = in_stack_fffffffffffffcec;
        x_02._0_4_ = in_stack_fffffffffffffce8;
        x_02._8_2_ = in_stack_fffffffffffffcf0;
        x_02._10_6_ = in_stack_fffffffffffffcf2;
        local_168 = map(local_148,(uint128_opt)x_02);
        value_04._8_7_ = in_stack_fffffffffffffd18;
        value_04._0_8_ = pfVar6;
        value_04[0xf] = in_stack_fffffffffffffd1f;
        local_158 = local_168;
        default_arg_formatter<char>::operator()<unsigned___int128,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd28,
                   (unsigned___int128)value_04);
        in_stack_fffffffffffffd10 = pfVar6;
        break;
      case 7:
        default_arg_formatter<char>::operator()<bool,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                   (bool)in_stack_fffffffffffffd1f);
        break;
      case 8:
        default_arg_formatter<char>::operator()<char,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (char)((ulong)in_stack_fffffffffffffcf8 >> 0x38));
        break;
      case 9:
        default_arg_formatter<char>::operator()<float,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,fVar7);
        break;
      case 10:
        default_arg_formatter<char>::operator()<double,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (double)in_stack_fffffffffffffcf8);
        break;
      case 0xb:
        Var1 = *(unkbyte10 *)in_stack_fffffffffffffd28;
        in_stack_fffffffffffffce8 = (undefined4)Var1;
        in_stack_fffffffffffffcec = (int)((unkuint10)Var1 >> 0x20);
        in_stack_fffffffffffffcf0 = (undefined2)((unkuint10)Var1 >> 0x40);
        default_arg_formatter<char>::operator()<long_double,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd10,
                   (longdouble)CONCAT28(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00));
        break;
      case 0xc:
        default_arg_formatter<char>::operator()<const_char_*,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,
                   (char *)in_stack_fffffffffffffcf8);
        break;
      case 0xd:
        in_stack_fffffffffffffd08 = SUB82(pfVar6,0);
        in_stack_fffffffffffffd0a = (undefined6)((ulong)pfVar6 >> 0x10);
        local_178 = string_value<char>::str((string_value<char> *)0x196ce0);
        value_00.data_._2_6_ = in_stack_fffffffffffffd0a;
        value_00.data_._0_2_ = in_stack_fffffffffffffd08;
        value_00.size_ = (size_t)in_stack_fffffffffffffd10;
        default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd00,value_00);
        break;
      case 0xe:
        default_arg_formatter<char>::operator()<const_void_*,_0>
                  ((default_arg_formatter<char> *)in_stack_fffffffffffffd20,
                   (void *)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
        break;
      case 0xf:
        local_198 = in_stack_fffffffffffffd28->value;
        local_190 = in_stack_fffffffffffffd28->format;
        basic_format_arg<fmt::v11::context>::handle::handle(&local_188,*in_stack_fffffffffffffd28);
        h_00.custom_.format =
             (_func_void_void_ptr_parse_context<char>_ptr_context_ptr *)in_stack_fffffffffffffd60;
        h_00.custom_.value = in_stack_fffffffffffffd58;
        default_arg_formatter<char>::operator()(in_stack_fffffffffffffd50,h_00);
        in_stack_fffffffffffffd00 = pfVar6;
      }
      local_1e8 = local_1f0 + 1;
    }
    local_250 = local_1e8;
    pcVar3 = local_250;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> fmt,
                                       Handler&& handler) {
  auto begin = fmt.data(), end = begin + fmt.size();
  auto p = begin;
  while (p != end) {
    auto c = *p++;
    if (c == '{') {
      handler.on_text(begin, p - 1);
      begin = p = parse_replacement_field(p - 1, end, handler);
    } else if (c == '}') {
      if (p == end || *p != '}')
        return handler.on_error("unmatched '}' in format string");
      handler.on_text(begin, p);
      begin = ++p;
    }
  }
  handler.on_text(begin, end);
}